

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  hugeint_t shift;
  hugeint_t shift_00;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  hugeint_t hVar8;
  ulong local_60;
  uint64_t in_stack_ffffffffffffffb0;
  ulong uVar9;
  uint64_t in_stack_ffffffffffffffc0;
  ulong in_stack_ffffffffffffffc8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 8;
      do {
        input_01.upper = in_stack_ffffffffffffffc8;
        input_01.lower = in_stack_ffffffffffffffc0;
        hVar8.upper = (int64_t)mask;
        hVar8.lower = in_stack_ffffffffffffffb0;
        hVar8 = BitwiseShiftLeftOperator::
                Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(input_01,hVar8);
        *(uint64_t *)((long)result_data + lVar4 + -8) = hVar8.lower;
        *(int64_t *)((long)&result_data->lower + lVar4) = hVar8.upper;
        lVar4 = lVar4 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = count + 0x3f >> 6;
    local_60 = 0;
    uVar5 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar2 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar2 = count;
        }
LAB_0071b7db:
        uVar3 = uVar5;
        if (uVar5 < uVar2) {
          uVar7 = uVar5 << 4 | 8;
          do {
            input_00.upper = in_stack_ffffffffffffffc8;
            input_00.lower = in_stack_ffffffffffffffc0;
            shift_00.upper = (int64_t)mask;
            shift_00.lower = uVar9;
            hVar8 = BitwiseShiftLeftOperator::
                    Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                              (input_00,shift_00);
            *(uint64_t *)((long)result_data + (uVar7 - 8)) = hVar8.lower;
            *(int64_t *)((long)&result_data->lower + uVar7) = hVar8.upper;
            uVar5 = uVar5 + 1;
            uVar7 = uVar7 + 0x10;
            uVar3 = uVar2;
          } while (uVar2 != uVar5);
        }
      }
      else {
        uVar7 = puVar1[local_60];
        uVar2 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar2 = count;
        }
        uVar3 = uVar2;
        if (uVar7 != 0) {
          if (uVar7 == 0xffffffffffffffff) goto LAB_0071b7db;
          in_stack_ffffffffffffffc8 = uVar2 - uVar5;
          uVar3 = uVar5;
          if (uVar5 <= uVar2 && in_stack_ffffffffffffffc8 != 0) {
            uVar5 = uVar5 << 4 | 8;
            uVar6 = 0;
            in_stack_ffffffffffffffc0 = uVar2;
            do {
              if ((uVar7 >> (uVar6 & 0x3f) & 1) != 0) {
                input.upper = in_stack_ffffffffffffffc8;
                input.lower = in_stack_ffffffffffffffc0;
                shift.upper = (int64_t)mask;
                shift.lower = uVar9;
                uVar2 = in_stack_ffffffffffffffc0;
                hVar8 = BitwiseShiftLeftOperator::
                        Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                  (input,shift);
                *(uint64_t *)((long)result_data + (uVar5 - 8)) = hVar8.lower;
                *(int64_t *)((long)&result_data->lower + uVar5) = hVar8.upper;
                in_stack_ffffffffffffffc0 = uVar2;
              }
              uVar6 = uVar6 + 1;
              uVar5 = uVar5 + 0x10;
              uVar3 = uVar2;
            } while (in_stack_ffffffffffffffc8 != uVar6);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar5 = uVar3;
    } while (local_60 != uVar9);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}